

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cachedarena.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Pool *pPVar1;
  int iVar2;
  bool bVar3;
  void *pvVar4;
  ostream *poVar5;
  long lVar6;
  int i;
  size_type sVar7;
  NoActionMemLogger logger;
  MallocArena arena;
  void *ptrs [9];
  CachedArena<cookmem::MallocArena> cachedArena;
  MemContext<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void> local_290
  ;
  
  cachedArena.m_arena = &arena;
  arena.m_minSize = 0x10000;
  cachedArena.m_tree.m_root = (Node *)0x0;
  pPVar1 = &local_290.m_pool;
  local_290._vptr_MemContext = (_func_int **)&PTR__MemContext_00105d88;
  lVar6 = 0;
  local_290.m_arena = &cachedArena;
  local_290.m_logger = &logger;
  local_290.m_pool.m_arena = &cachedArena;
  local_290.m_pool.m_logger = &logger;
  memset(&local_290.m_pool.m_footprintLimit,0,0x232);
  local_290.m_pool.m_paddingByte = -0x33;
  sVar7 = 3;
  while (lVar6 != 9) {
    sVar7 = sVar7 * 10;
    pvVar4 = cookmem::
             MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
             allocate(pPVar1,sVar7);
    ptrs[lVar6] = pvVar4;
    bVar3 = cookmem::
            MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
            contains(pPVar1,pvVar4,false);
    if (!bVar3) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
      iVar2 = 0x2a;
      goto LAB_0010237d;
    }
    lVar6 = lVar6 + 1;
    if (pvVar4 == (void *)0x0) goto LAB_001022de;
  }
  for (lVar6 = 0; lVar6 != 9; lVar6 = lVar6 + 1) {
    cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
    deallocate(pPVar1,ptrs[lVar6],0);
  }
  cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
  releaseAll(pPVar1);
  lVar6 = 0;
  do {
    if (lVar6 == 9) {
      cookmem::
      MemContext<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
      ~MemContext(&local_290);
      local_290._vptr_MemContext = (_func_int **)&PTR__MemContext_00105d88;
      pPVar1 = &local_290.m_pool;
      lVar6 = 0;
      local_290.m_arena = &cachedArena;
      local_290.m_logger = &logger;
      local_290.m_pool.m_arena = &cachedArena;
      local_290.m_pool.m_logger = &logger;
      memset(&local_290.m_pool.m_footprintLimit,0,0x232);
      local_290.m_pool.m_paddingByte = -0x33;
      sVar7 = 3;
      goto LAB_00102427;
    }
    bVar3 = cookmem::
            MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
            contains(pPVar1,ptrs[lVar6],false);
    lVar6 = lVar6 + 1;
  } while (!bVar3);
  poVar5 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x36);
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_0010238e:
  cookmem::MemContext<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>
  ::~MemContext(&local_290);
  poVar5 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5b);
  std::endl<char,std::char_traits<char>>(poVar5);
  return 1;
LAB_001022de:
  poVar5 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
  iVar2 = 0x2b;
LAB_0010237d:
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
  std::endl<char,std::char_traits<char>>(poVar5);
  goto LAB_0010238e;
LAB_00102427:
  if (lVar6 == 9) {
    for (lVar6 = 0; lVar6 != 9; lVar6 = lVar6 + 1) {
      cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>
      ::deallocate(pPVar1,ptrs[lVar6],0);
    }
    cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
    releaseAll(pPVar1);
    lVar6 = 0;
    do {
      if (lVar6 == 9) {
        cookmem::
        MemContext<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
        ~MemContext(&local_290);
        return 0;
      }
      bVar3 = cookmem::
              MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>
              ::contains(pPVar1,ptrs[lVar6],false);
      lVar6 = lVar6 + 1;
    } while (!bVar3);
    poVar5 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x50);
    std::endl<char,std::char_traits<char>>(poVar5);
    goto LAB_0010238e;
  }
  sVar7 = sVar7 * 10;
  pvVar4 = cookmem::
           MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
           allocate(pPVar1,sVar7);
  ptrs[lVar6] = pvVar4;
  bVar3 = cookmem::
          MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
          contains(pPVar1,pvVar4,false);
  if (!bVar3) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
    iVar2 = 0x44;
    goto LAB_001024ff;
  }
  lVar6 = lVar6 + 1;
  if (pvVar4 == (void *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
    iVar2 = 0x45;
LAB_001024ff:
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    std::endl<char,std::char_traits<char>>(poVar5);
    goto LAB_0010238e;
  }
  goto LAB_00102427;
}

Assistant:

int
main (int argc, const char* argv[])
{
    ASSERT_EQ (0, test1 ());

    return 0;
}